

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>_> * __thiscall
Parser::parseFunctionDeclarationExpression
          (optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>_> *__return_storage_ptr__,
          Parser *this)

{
  int iVar1;
  undefined8 uVar2;
  char cVar3;
  optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>_> *poVar4;
  TokenType type;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  char cVar5;
  undefined1 local_128 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  undefined1 local_108 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  undefined1 local_e8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  undefined1 local_c8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  undefined1 local_a8 [24];
  vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> parameters;
  undefined1 auStack_78 [8];
  vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  statements;
  undefined1 local_58 [8];
  optional<std::shared_ptr<StatementAstNode>_> statement;
  char local_31;
  bool error;
  
  local_31 = '\0';
  local_a8._16_8_ = (ostream *)0x0;
  parameters.super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parameters.super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  statements.
  super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)__return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,"Expected function keyword for function definition",
             (allocator<char> *)auStack_78);
  type = (TokenType)this;
  expect((Parser *)local_128,type,(bool *)0x9,(string *)&local_31);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
  std::__cxx11::string::~string((string *)local_58);
  skipWhiteSpace(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,"Expected left paren following function definition",
             (allocator<char> *)auStack_78);
  expect((Parser *)(local_128 + 0x10),type,(bool *)0x5,(string *)&local_31);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110);
  std::__cxx11::string::~string((string *)local_58);
  do {
    skipWhiteSpace(this);
    TokenBuffer::currentToken((TokenBuffer *)local_58);
    iVar1 = *(int *)&((AstNode *)&((_List_node_base *)((long)local_58 + 0x20))->_M_next)->
                     _vptr_AstNode;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&statement);
    if (iVar1 == 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_58,
                 "Expected a right paren to close parameter list of function definition",
                 (allocator<char> *)auStack_78);
      expect((Parser *)local_108,type,(bool *)0x6,(string *)&local_31);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
      std::__cxx11::string::~string((string *)local_58);
      *(undefined1 *)
       &statements.
        super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage[1].
        super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
      poVar4 = (optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>_> *)
               statements.
               super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      goto LAB_0010cb95;
    }
    TokenBuffer::currentToken((TokenBuffer *)local_58);
    iVar1 = *(int *)&((AstNode *)&((_List_node_base *)((long)local_58 + 0x20))->_M_next)->
                     _vptr_AstNode;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&statement);
    if (iVar1 == 6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_58,
                 "Expected a right paren to close parameter list of function definition",
                 (allocator<char> *)auStack_78);
      expect((Parser *)(local_108 + 0x10),type,(bool *)0x6,(string *)&local_31);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0);
      std::__cxx11::string::~string((string *)local_58);
      break;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_58,"Expected identifier as parameter of function definition",
               (allocator<char> *)&stack0xffffffffffffffce);
    expect((Parser *)auStack_78,type,(bool *)0x18,(string *)&local_31);
    std::__cxx11::string::~string((string *)local_58);
    skipWhiteSpace(this);
    if (*(int *)&(((shared_ptr<Tokenizer> *)((long)auStack_78 + 0x18))->
                 super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi ==
        0x18) {
      std::vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>::push_back
                ((vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *)
                 (local_a8 + 0x10),(value_type *)auStack_78);
    }
    else {
      local_31 = '\x01';
    }
    TokenBuffer::currentToken((TokenBuffer *)local_58);
    iVar1 = *(int *)&((AstNode *)&((_List_node_base *)((long)local_58 + 0x20))->_M_next)->
                     _vptr_AstNode;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&statement);
    if (iVar1 == 6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_58,
                 "Expected a right paren to close parameter list of function definition",
                 (allocator<char> *)&stack0xffffffffffffffce);
      expect((Parser *)local_e8,type,(bool *)0x6,(string *)&local_31);
      this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_58,
                 "Expected a comma between function parameters in function definition",
                 (allocator<char> *)&stack0xffffffffffffffce);
      expect((Parser *)(local_e8 + 0x10),type,(bool *)0x13,(string *)&local_31);
      this_00 = &local_d0;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
    std::__cxx11::string::~string((string *)local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&statements);
  } while (iVar1 != 6);
  skipWhiteSpace(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,
             "Expected left curly bracket after to begin function body definition",
             (allocator<char> *)auStack_78);
  expect((Parser *)local_c8,type,(bool *)0x2,(string *)&local_31);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
  std::__cxx11::string::~string((string *)local_58);
  statements.
  super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_78 = (undefined1  [8])0x0;
  statements.
  super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cVar5 = local_31;
  do {
    skipWhiteSpace(this);
    TokenBuffer::currentToken((TokenBuffer *)local_58);
    iVar1 = *(int *)&((AstNode *)&((_List_node_base *)((long)local_58 + 0x20))->_M_next)->
                     _vptr_AstNode;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&statement);
    if (iVar1 == 1) {
      local_31 = cVar5;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_58,"Expected a right curly bracket to end function definition",
                 (allocator<char> *)&stack0xffffffffffffffce);
      expect((Parser *)(local_c8 + 0x10),type,(bool *)0x3,(string *)&local_31);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0);
      std::__cxx11::string::~string((string *)local_58);
LAB_0010cb46:
      *(undefined1 *)
       &statements.
        super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage[1].
        super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
      poVar4 = (optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>_> *)
               statements.
               super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
LAB_0010cb8c:
      std::
      vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
      ::~vector((vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                 *)auStack_78);
LAB_0010cb95:
      std::vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>::~vector
                ((vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *)
                 (local_a8 + 0x10));
      return poVar4;
    }
    TokenBuffer::currentToken((TokenBuffer *)local_58);
    iVar1 = *(int *)&((AstNode *)&((_List_node_base *)((long)local_58 + 0x20))->_M_next)->
                     _vptr_AstNode;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&statement);
    if (iVar1 == 3) {
      local_31 = cVar5;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_58,"Expected a right curly bracket to end function definition",
                 (allocator<char> *)&stack0xffffffffffffffce);
      expect((Parser *)local_a8,type,(bool *)0x3,(string *)&local_31);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
      std::__cxx11::string::~string((string *)local_58);
      if (local_31 != '\0') goto LAB_0010cb46;
      std::
      make_shared<FunctionDeclarationExpressionAstNode,std::vector<std::shared_ptr<Token>,std::allocator<std::shared_ptr<Token>>>&,std::vector<std::shared_ptr<StatementAstNode>,std::allocator<std::shared_ptr<StatementAstNode>>>&>
                ((vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *)
                 local_58,(vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                           *)(local_a8 + 0x10));
      uVar2 = statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
              super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      poVar4 = (optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>_> *)
               statements.
               super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      ((statements.
        super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage)->
      super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)local_58;
      statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
      super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      ((statements.
        super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage)->
      super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
      local_58 = (undefined1  [8])0x0;
      *(undefined1 *)
       &statements.
        super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage[1].
        super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&statement);
      goto LAB_0010cb8c;
    }
    parseStatement((optional<std::shared_ptr<StatementAstNode>_> *)local_58,this);
    cVar3 = '\x01';
    if (statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_ == '\x01')
    {
      std::
      vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
      ::push_back((vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                   *)auStack_78,(value_type *)local_58);
      cVar3 = cVar5;
    }
    cVar5 = cVar3;
    std::_Optional_payload_base<std::shared_ptr<StatementAstNode>_>::_M_reset
              ((_Optional_payload_base<std::shared_ptr<StatementAstNode>_> *)local_58);
  } while( true );
}

Assistant:

const std::optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>>
Parser::parseFunctionDeclarationExpression() noexcept {
  bool error = false;
  std::vector<std::shared_ptr<Token>> parameters;

  this->expect(TokenType::Function, error, "Expected function keyword for function definition");

  this->skipWhiteSpace();

  this->expect(TokenType::LeftParen, error, "Expected left paren following function definition");

  while (true) {
    this->skipWhiteSpace();

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile) {
      this->expect(TokenType::RightParen, error,
        "Expected a right paren to close parameter list of function definition");
      return std::nullopt;
    }

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::RightParen) {
      this->expect(TokenType::RightParen, error,
        "Expected a right paren to close parameter list of function definition");
      break;
    }

    auto token = this->expect(TokenType::Identifier, error,
      "Expected identifier as parameter of function definition");

    this->skipWhiteSpace();

    if (token->tokenType != TokenType::Identifier) {
      error = true;

    } else {
      parameters.push_back(token);
    }

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::RightParen) {
      this->expect(TokenType::RightParen, error,
        "Expected a right paren to close parameter list of function definition");
      break;
    }

    this->expect(TokenType::Comma, error,
      "Expected a comma between function parameters in function definition");
  }

  this->skipWhiteSpace();

  this->expect(TokenType::LeftCurly, error,
    "Expected left curly bracket after to begin function body definition");

  std::vector<std::shared_ptr<StatementAstNode>> statements;

  while (true) {
    this->skipWhiteSpace();

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile) {
      this->expect(TokenType::RightCurly, error,
        "Expected a right curly bracket to end function definition");
      return std::nullopt;
    }

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::RightCurly) {
      this->expect(TokenType::RightCurly, error,
        "Expected a right curly bracket to end function definition");
      break;
    }

    auto statement = this->parseStatement();

    if (!statement) {
      error = true;

    } else {
      statements.push_back(statement.value());
    }
  }

  if (error) { return std::nullopt; }

  return std::make_shared<FunctionDeclarationExpressionAstNode>(parameters, statements);
}